

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void divide_subset_split<float,unsigned_long>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,double split_point,MissingAction missing_action,
               size_t *st_NA,size_t *end_NA,size_t *split_ix)

{
  ulong *puVar1;
  ulong uVar2;
  long lVar3;
  size_t *r;
  size_t sVar4;
  ulong *puVar5;
  ulong *puVar6;
  bool bVar7;
  size_t *psVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  
  uVar10 = Xc_indptr[col_num];
  uVar2 = Xc_indptr[col_num + 1];
  if (uVar10 == uVar2) {
    sVar4 = end + 1;
    if (split_point < 0.0) {
      sVar4 = st;
    }
    psVar8 = split_ix;
    if (missing_action != Fail) {
      *st_NA = sVar4;
      psVar8 = end_NA;
    }
    *psVar8 = sVar4;
  }
  puVar1 = ix_arr + st;
  puVar15 = ix_arr + end + 1;
  uVar13 = (long)puVar15 - (long)puVar1 >> 3;
  puVar6 = puVar1;
  if (0 < (long)uVar13) {
    do {
      uVar16 = uVar13 >> 1;
      uVar19 = ~uVar16 + uVar13;
      uVar13 = uVar16;
      if (puVar6[uVar16] < Xc_ind[uVar10]) {
        puVar6 = puVar6 + uVar16 + 1;
        uVar13 = uVar19;
      }
    } while (0 < (long)uVar13);
  }
  uVar13 = uVar2 - 1;
  sVar4 = (long)puVar6 - (long)ix_arr >> 3;
  if (puVar6 <= puVar1) {
    sVar4 = st;
  }
  uVar16 = Xc_ind[uVar2 - 1];
  puVar1 = ix_arr + end;
  if (split_point < 0.0) {
    sVar4 = st;
  }
  if (missing_action == Fail) {
    if (split_point < 0.0) {
      if (uVar10 != uVar2 && puVar6 != puVar15) {
        while (uVar19 = *puVar6, uVar19 <= uVar16) {
          puVar9 = Xc_ind + uVar10;
          uVar14 = *puVar9;
          if (uVar14 == uVar19) {
            if ((double)Xc[uVar10] <= split_point) {
              uVar14 = ix_arr[st];
              ix_arr[st] = uVar19;
              *puVar6 = uVar14;
              st = st + 1;
            }
            if ((puVar6 == puVar1) || (uVar10 == uVar13)) break;
            puVar5 = puVar9 + 1;
            puVar6 = puVar6 + 1;
            uVar10 = (long)((long)Xc_ind + (uVar2 * 8 - (long)puVar5)) >> 3;
            if (0 < (long)uVar10) {
              do {
                uVar19 = uVar10 >> 1;
                uVar14 = ~uVar19 + uVar10;
                uVar10 = uVar19;
                if (puVar5[uVar19] < *puVar6) {
                  puVar5 = puVar5 + uVar19 + 1;
                  uVar10 = uVar14;
                }
              } while (0 < (long)uVar10);
            }
LAB_002f2d5c:
            uVar10 = (long)puVar5 - (long)Xc_ind >> 3;
          }
          else {
            if (uVar14 <= uVar19) {
              puVar5 = puVar9 + 1;
              uVar10 = (long)((long)Xc_ind + (uVar2 * 8 - (long)(puVar9 + 1))) >> 3;
              while (0 < (long)uVar10) {
                uVar14 = uVar10 >> 1;
                uVar17 = ~uVar14 + uVar10;
                uVar10 = uVar14;
                if (puVar5[uVar14] < uVar19) {
                  puVar5 = puVar5 + uVar14 + 1;
                  uVar10 = uVar17;
                }
              }
              goto LAB_002f2d5c;
            }
            puVar6 = puVar6 + 1;
            uVar19 = (long)puVar15 - (long)puVar6 >> 3;
            while (0 < (long)uVar19) {
              uVar17 = uVar19 >> 1;
              uVar11 = ~uVar17 + uVar19;
              uVar19 = uVar17;
              if (puVar6[uVar17] < uVar14) {
                puVar6 = puVar6 + uVar17 + 1;
                uVar19 = uVar11;
              }
            }
          }
          if ((puVar6 == puVar15) || (uVar10 == uVar2)) break;
        }
      }
    }
    else {
      while (st = sVar4, puVar6 != puVar15) {
        if (uVar2 <= uVar10) goto LAB_002f2a98;
        puVar9 = Xc_ind + uVar10;
        uVar16 = *puVar9;
        uVar19 = *puVar6;
        if (uVar16 == uVar19) {
          if ((double)Xc[uVar10] <= split_point) {
            uVar19 = ix_arr[st];
            ix_arr[st] = uVar16;
            *puVar6 = uVar19;
            st = st + 1;
          }
          puVar5 = puVar6 + 1;
          if (((puVar6 < puVar1) && (puVar5 <= puVar1)) && (puVar12 = puVar5, uVar10 == uVar13)) {
            do {
              uVar16 = ix_arr[st];
              ix_arr[st] = *puVar12;
              *puVar12 = uVar16;
              st = st + 1;
              puVar12 = puVar12 + 1;
            } while (puVar12 <= puVar1);
          }
          if ((uVar10 == uVar13) || (puVar6 == puVar1)) break;
          puVar9 = puVar9 + 1;
          uVar10 = (long)((long)Xc_ind + (uVar2 * 8 - (long)puVar9)) >> 3;
          if (0 < (long)uVar10) {
            do {
              uVar16 = uVar10 >> 1;
              uVar19 = ~uVar16 + uVar10;
              uVar10 = uVar16;
              if (puVar9[uVar16] < *puVar5) {
                puVar9 = puVar9 + uVar16 + 1;
                uVar10 = uVar19;
              }
            } while (0 < (long)uVar10);
          }
          uVar10 = (long)puVar9 - (long)Xc_ind >> 3;
          puVar6 = puVar5;
          sVar4 = st;
        }
        else if (uVar19 < uVar16) {
          for (; (sVar4 = st, puVar6 <= puVar1 && (*puVar6 < *puVar9)); puVar6 = puVar6 + 1) {
            uVar16 = ix_arr[st];
            ix_arr[st] = *puVar6;
            *puVar6 = uVar16;
            st = st + 1;
          }
        }
        else {
          puVar5 = puVar9 + 1;
          uVar10 = (long)((long)Xc_ind + (uVar2 * 8 - (long)(puVar9 + 1))) >> 3;
          while (0 < (long)uVar10) {
            uVar16 = uVar10 >> 1;
            uVar14 = ~uVar16 + uVar10;
            uVar10 = uVar16;
            if (puVar5[uVar16] < uVar19) {
              puVar5 = puVar5 + uVar16 + 1;
              uVar10 = uVar14;
            }
          }
          uVar10 = (long)puVar5 - (long)Xc_ind >> 3;
          sVar4 = st;
        }
      }
    }
    goto LAB_002f2d96;
  }
  if (split_point < 0.0) {
    if (uVar10 != uVar2 && puVar6 != puVar15) {
      bVar7 = false;
      uVar19 = uVar10;
      while (uVar14 = *puVar6, uVar14 <= uVar16) {
        puVar9 = Xc_ind + uVar19;
        uVar17 = *puVar9;
        if (uVar17 == uVar14) {
          if (NAN(Xc[uVar19])) {
            bVar7 = true;
          }
          else if ((double)Xc[uVar19] <= split_point) {
            uVar17 = ix_arr[st];
            ix_arr[st] = uVar14;
            *puVar6 = uVar17;
            st = st + 1;
          }
          if ((puVar6 == puVar1) || (uVar19 == uVar13)) break;
          puVar5 = puVar9 + 1;
          puVar6 = puVar6 + 1;
          uVar19 = (long)((long)Xc_ind + (uVar2 * 8 - (long)puVar5)) >> 3;
          if (0 < (long)uVar19) {
            do {
              uVar14 = uVar19 >> 1;
              uVar17 = ~uVar14 + uVar19;
              uVar19 = uVar14;
              if (puVar5[uVar14] < *puVar6) {
                puVar5 = puVar5 + uVar14 + 1;
                uVar19 = uVar17;
              }
            } while (0 < (long)uVar19);
          }
LAB_002f2bf4:
          uVar19 = (long)puVar5 - (long)Xc_ind >> 3;
        }
        else {
          if (uVar17 <= uVar14) {
            puVar5 = puVar9 + 1;
            uVar19 = (long)((long)Xc_ind + (uVar2 * 8 - (long)(puVar9 + 1))) >> 3;
            while (0 < (long)uVar19) {
              uVar17 = uVar19 >> 1;
              uVar11 = ~uVar17 + uVar19;
              uVar19 = uVar17;
              if (puVar5[uVar17] < uVar14) {
                puVar5 = puVar5 + uVar17 + 1;
                uVar19 = uVar11;
              }
            }
            goto LAB_002f2bf4;
          }
          puVar6 = puVar6 + 1;
          uVar14 = (long)puVar15 - (long)puVar6 >> 3;
          while (0 < (long)uVar14) {
            uVar11 = uVar14 >> 1;
            uVar18 = ~uVar11 + uVar14;
            uVar14 = uVar11;
            if (puVar6[uVar11] < uVar17) {
              puVar6 = puVar6 + uVar11 + 1;
              uVar14 = uVar18;
            }
          }
        }
        if ((puVar6 == puVar15) || (uVar19 == uVar2)) break;
      }
      goto LAB_002f2747;
    }
  }
  else {
    st = sVar4;
    if (puVar6 != puVar15) {
      bVar7 = false;
      uVar19 = uVar10;
      do {
        if (uVar2 <= uVar19) goto LAB_002f2742;
        puVar9 = Xc_ind + uVar19;
        uVar14 = *puVar9;
        uVar17 = *puVar6;
        if (uVar14 == uVar17) {
          if (NAN(Xc[uVar19])) {
            bVar7 = true;
          }
          else if ((double)Xc[uVar19] <= split_point) {
            uVar17 = ix_arr[st];
            ix_arr[st] = uVar14;
            *puVar6 = uVar17;
            st = st + 1;
          }
          puVar5 = puVar6 + 1;
          if (((puVar6 < puVar1) && (puVar5 <= puVar1)) && (puVar12 = puVar5, uVar19 == uVar13)) {
            do {
              uVar14 = ix_arr[st];
              ix_arr[st] = *puVar12;
              *puVar12 = uVar14;
              st = st + 1;
              puVar12 = puVar12 + 1;
            } while (puVar12 <= puVar1);
          }
          if ((uVar19 == uVar13) || (puVar6 == puVar1)) break;
          puVar9 = puVar9 + 1;
          uVar19 = (long)((long)Xc_ind + (uVar2 * 8 - (long)puVar9)) >> 3;
          if (0 < (long)uVar19) {
            do {
              uVar14 = uVar19 >> 1;
              uVar17 = ~uVar14 + uVar19;
              uVar19 = uVar14;
              if (puVar9[uVar14] < *puVar5) {
                puVar9 = puVar9 + uVar14 + 1;
                uVar19 = uVar17;
              }
            } while (0 < (long)uVar19);
          }
          uVar19 = (long)puVar9 - (long)Xc_ind >> 3;
          puVar6 = puVar5;
        }
        else if (uVar17 < uVar14) {
          for (; (puVar6 <= puVar1 && (*puVar6 < *puVar9)); puVar6 = puVar6 + 1) {
            uVar14 = ix_arr[st];
            ix_arr[st] = *puVar6;
            *puVar6 = uVar14;
            st = st + 1;
          }
        }
        else {
          puVar5 = puVar9 + 1;
          uVar19 = (long)((long)Xc_ind + (uVar2 * 8 - (long)(puVar9 + 1))) >> 3;
          while (0 < (long)uVar19) {
            uVar14 = uVar19 >> 1;
            uVar11 = ~uVar14 + uVar19;
            uVar19 = uVar14;
            if (puVar5[uVar14] < uVar17) {
              puVar5 = puVar5 + uVar14 + 1;
              uVar19 = uVar11;
            }
          }
          uVar19 = (long)puVar5 - (long)Xc_ind >> 3;
        }
      } while (puVar6 != puVar15);
LAB_002f2747:
      *st_NA = st;
      if ((bVar7) && (puVar6 = ix_arr + st, puVar6 != puVar15)) {
        uVar19 = (long)puVar15 - (long)puVar6 >> 3;
        lVar3 = 0x3f;
        if (uVar19 != 0) {
          for (; uVar19 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::__introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar6,puVar15,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar6,puVar15);
        if (uVar10 != uVar2 && puVar6 != puVar15) {
          while (uVar19 = *puVar6, uVar19 <= uVar16) {
            puVar9 = Xc_ind + uVar10;
            uVar14 = *puVar9;
            if (uVar14 == uVar19) {
              if (NAN(Xc[uVar10])) {
                uVar14 = ix_arr[st];
                ix_arr[st] = uVar19;
                *puVar6 = uVar14;
                st = st + 1;
              }
              if ((puVar6 == puVar1) || (uVar10 == uVar13)) break;
              puVar5 = puVar9 + 1;
              puVar6 = puVar6 + 1;
              uVar10 = (long)((long)Xc_ind + (uVar2 * 8 - (long)puVar5)) >> 3;
              if (0 < (long)uVar10) {
                do {
                  uVar19 = uVar10 >> 1;
                  uVar14 = ~uVar19 + uVar10;
                  uVar10 = uVar19;
                  if (puVar5[uVar19] < *puVar6) {
                    puVar5 = puVar5 + uVar19 + 1;
                    uVar10 = uVar14;
                  }
                } while (0 < (long)uVar10);
              }
LAB_002f28de:
              uVar10 = (long)puVar5 - (long)Xc_ind >> 3;
            }
            else {
              if (uVar14 <= uVar19) {
                puVar5 = puVar9 + 1;
                uVar10 = (long)((long)Xc_ind + (uVar2 * 8 - (long)(puVar9 + 1))) >> 3;
                while (0 < (long)uVar10) {
                  uVar14 = uVar10 >> 1;
                  uVar17 = ~uVar14 + uVar10;
                  uVar10 = uVar14;
                  if (puVar5[uVar14] < uVar19) {
                    puVar5 = puVar5 + uVar14 + 1;
                    uVar10 = uVar17;
                  }
                }
                goto LAB_002f28de;
              }
              puVar6 = puVar6 + 1;
              uVar19 = (long)puVar15 - (long)puVar6 >> 3;
              while (0 < (long)uVar19) {
                uVar17 = uVar19 >> 1;
                uVar11 = ~uVar17 + uVar19;
                uVar19 = uVar17;
                if ((puVar6 + uVar17 + 1)[-1] < uVar14) {
                  puVar6 = puVar6 + uVar17 + 1;
                  uVar19 = uVar11;
                }
              }
            }
            if ((puVar6 == puVar15) || (uVar10 == uVar2)) break;
          }
        }
      }
      goto LAB_002f2d8e;
    }
  }
  *st_NA = st;
LAB_002f2d8e:
  *end_NA = st;
  return;
LAB_002f2742:
  for (; puVar6 <= puVar1; puVar6 = puVar6 + 1) {
    uVar19 = ix_arr[st];
    ix_arr[st] = *puVar6;
    *puVar6 = uVar19;
    st = st + 1;
  }
  goto LAB_002f2747;
LAB_002f2a98:
  for (; puVar6 <= puVar1; puVar6 = puVar6 + 1) {
    uVar10 = ix_arr[st];
    ix_arr[st] = *puVar6;
    *puVar6 = uVar10;
    st = st + 1;
  }
LAB_002f2d96:
  *split_ix = st;
  return;
}

Assistant:

void divide_subset_split(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                         real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr, double split_point,
                         MissingAction missing_action, size_t &restrict st_NA, size_t &restrict end_NA, size_t &restrict split_ix) noexcept
{
    /* TODO: this is a mess, needs refactoring */
    /* TODO: when moving zeros, would be better to instead move by '>' (opposite as in here) */
    /* TODO: should create an extra version to go along with 'predict' that would
       add the range penalty right here to spare operations. */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        if (missing_action == Fail)
        {
            split_ix = (0 <= split_point)? (end+1) : st;
        }

        else
        {
            st_NA  = (0 <= split_point)? (end+1) : st;
            end_NA = (0 <= split_point)? (end+1) : st;
        }

    }

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t temp;
    bool   move_zeros = 0 <= split_point;
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    if (move_zeros && ptr_st > ix_arr + st)
        st = ptr_st - ix_arr;

    if (missing_action == Fail)
    {
        if (move_zeros)
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1;
                )
            {
                if (curr_pos >= end_col + 1)
                {
                    for (size_t *r = row; r <= ix_arr + end; r++)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *r;
                        *r         = temp;
                        st++;
                    }
                    break;
                }

                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (curr_pos == end_col && row < ix_arr + end)
                    {
                        for (size_t *r = row + 1; r <= ix_arr + end; r++)
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *r;
                            *r         = temp;
                            st++;
                        }
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    {
                        while (row <= ix_arr + end && Xc_ind[curr_pos] > (sparse_ix)(*row))
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *row;
                            *row       = temp;
                            st++; row++;
                        }
                    }

                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }

        else /* don't move zeros */
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }

        split_ix = st;
    }

    else /* can have NAs */
    {

        bool has_NAs = false;
        if (move_zeros)
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1;
                )
            {
                if (curr_pos >= end_col + 1)
                {
                    for (size_t *r = row; r <= ix_arr + end; r++)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *r;
                        *r         = temp;
                        st++;
                    }
                    break;
                }

                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos])))
                        has_NAs = true;
                    else if (Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (curr_pos == end_col && row < ix_arr + end)
                        for (size_t *r = row + 1; r <= ix_arr + end; r++)
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *r;
                            *r         = temp;
                            st++;
                        }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    {
                        while (row <= ix_arr + end && Xc_ind[curr_pos] > (sparse_ix)(*row))
                        {
                            temp       = ix_arr[st];
                            ix_arr[st] = *row;
                            *row       = temp;
                            st++; row++;
                        }
                    }

                    else
                    {
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                    }
                }
            }
        }

        else /* don't move zeros */
        {
            for (size_t *row = ptr_st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos]))) has_NAs = true;
                    if (!std::isnan(Xc[curr_pos]) && Xc[curr_pos] <= split_point)
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }


        st_NA = st;
        if (has_NAs)
        {
            curr_pos = st_col;
            std::sort(ix_arr + st, ix_arr + end + 1);
            for (size_t *row = ix_arr + st;
                 row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (Xc_ind[curr_pos] == (sparse_ix)(*row))
                {
                    if (unlikely(std::isnan(Xc[curr_pos])))
                    {
                        temp       = ix_arr[st];
                        ix_arr[st] = *row;
                        *row       = temp;
                        st++;
                    }
                    if (row == ix_arr + end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
                }

                else
                {
                    if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                        row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
                }
            }
        }
        end_NA = st;

    }

}